

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.c
# Opt level: O1

void asm_append_u16(MCodeChunk *chunk,uint16_t arg)

{
  asm_append_u8(chunk,(uint8_t)arg);
  asm_append_u8(chunk,(uint8_t)(arg >> 8));
  return;
}

Assistant:

void asm_append_u16(MCodeChunk *chunk, uint16_t arg) {
#if ARCH_ENDIAN == ENDIAN_LITTLE
	asm_append_u8(chunk, (uint8_t) arg);
	asm_append_u8(chunk, (uint8_t) (arg >> 8));
#else
	asm_append_u8(chunk, (uint8_t) (arg >> 8));
	asm_append_u8(chunk, (uint8_t) arg);
#endif
}